

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syntax_if.cpp
# Opt level: O2

unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_> __thiscall
pfederc::Parser::parseIf(Parser *this,bool isensure)

{
  Token *pTVar1;
  _Tuple_impl<1UL,_std::unique_ptr<pfederc::BodyExpr,_std::default_delete<pfederc::BodyExpr>_>_>
  _Var2;
  bool bVar3;
  _Head_base<0UL,_pfederc::Expr_*,_false> _Var4;
  undefined7 in_register_00000031;
  Parser *this_00;
  bool isensure_local;
  IfCase ifcase;
  unique_ptr<pfederc::BodyExpr,_std::default_delete<pfederc::BodyExpr>_> elseBody;
  undefined2 local_92;
  _Head_base<0UL,_pfederc::Expr_*,_false> local_90;
  vector<std::tuple<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::BodyExpr,_std::default_delete<pfederc::BodyExpr>_>_>,_std::allocator<std::tuple<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::BodyExpr,_std::default_delete<pfederc::BodyExpr>_>_>_>_>
  cases;
  undefined1 local_6c [4];
  IfCase startifcase;
  vector<std::tuple<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::BodyExpr,_std::default_delete<pfederc::BodyExpr>_>_>,_std::allocator<std::tuple<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::BodyExpr,_std::default_delete<pfederc::BodyExpr>_>_>_>_>
  local_58;
  
  this_00 = (Parser *)CONCAT71(in_register_00000031,isensure);
  pTVar1 = this_00->lexer->currentToken;
  local_58.
  super__Vector_base<std::tuple<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::BodyExpr,_std::default_delete<pfederc::BodyExpr>_>_>,_std::allocator<std::tuple<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::BodyExpr,_std::default_delete<pfederc::BodyExpr>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)(pTVar1->pos).line;
  local_58.
  super__Vector_base<std::tuple<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::BodyExpr,_std::default_delete<pfederc::BodyExpr>_>_>,_std::allocator<std::tuple<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::BodyExpr,_std::default_delete<pfederc::BodyExpr>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)(pTVar1->pos).startIndex;
  local_58.
  super__Vector_base<std::tuple<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::BodyExpr,_std::default_delete<pfederc::BodyExpr>_>_>,_std::allocator<std::tuple<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::BodyExpr,_std::default_delete<pfederc::BodyExpr>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)(pTVar1->pos).endIndex;
  cases.
  super__Vector_base<std::tuple<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::BodyExpr,_std::default_delete<pfederc::BodyExpr>_>_>,_std::allocator<std::tuple<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::BodyExpr,_std::default_delete<pfederc::BodyExpr>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  cases.
  super__Vector_base<std::tuple<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::BodyExpr,_std::default_delete<pfederc::BodyExpr>_>_>,_std::allocator<std::tuple<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::BodyExpr,_std::default_delete<pfederc::BodyExpr>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  cases.
  super__Vector_base<std::tuple<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::BodyExpr,_std::default_delete<pfederc::BodyExpr>_>_>,_std::allocator<std::tuple<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::BodyExpr,_std::default_delete<pfederc::BodyExpr>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_90._M_head_impl = (Expr *)this;
  parseIfStart((Parser *)&startifcase,isensure);
  if (startifcase.
      super__Tuple_impl<0UL,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::BodyExpr,_std::default_delete<pfederc::BodyExpr>_>_>
      .
      super__Tuple_impl<1UL,_std::unique_ptr<pfederc::BodyExpr,_std::default_delete<pfederc::BodyExpr>_>_>
      .
      super__Head_base<1UL,_std::unique_ptr<pfederc::BodyExpr,_std::default_delete<pfederc::BodyExpr>_>,_false>
      ._M_head_impl._M_t.
      super___uniq_ptr_impl<pfederc::BodyExpr,_std::default_delete<pfederc::BodyExpr>_>._M_t.
      super__Tuple_impl<0UL,_pfederc::BodyExpr_*,_std::default_delete<pfederc::BodyExpr>_>.
      super__Head_base<0UL,_pfederc::BodyExpr_*,_false>._M_head_impl !=
      (unique_ptr<pfederc::BodyExpr,_std::default_delete<pfederc::BodyExpr>_>)0x0 &&
      startifcase.
      super__Tuple_impl<0UL,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::BodyExpr,_std::default_delete<pfederc::BodyExpr>_>_>
      .
      super__Head_base<0UL,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_false>
      ._M_head_impl._M_t.super___uniq_ptr_impl<pfederc::Expr,_std::default_delete<pfederc::Expr>_>.
      _M_t.super__Tuple_impl<0UL,_pfederc::Expr_*,_std::default_delete<pfederc::Expr>_>.
      super__Head_base<0UL,_pfederc::Expr_*,_false>._M_head_impl !=
      (__uniq_ptr_data<pfederc::Expr,_std::default_delete<pfederc::Expr>,_true,_true>)0x0) {
    std::
    vector<std::tuple<std::unique_ptr<pfederc::Expr,std::default_delete<pfederc::Expr>>,std::unique_ptr<pfederc::BodyExpr,std::default_delete<pfederc::BodyExpr>>>,std::allocator<std::tuple<std::unique_ptr<pfederc::Expr,std::default_delete<pfederc::Expr>>,std::unique_ptr<pfederc::BodyExpr,std::default_delete<pfederc::BodyExpr>>>>>
    ::
    emplace_back<std::tuple<std::unique_ptr<pfederc::Expr,std::default_delete<pfederc::Expr>>,std::unique_ptr<pfederc::BodyExpr,std::default_delete<pfederc::BodyExpr>>>>
              ((vector<std::tuple<std::unique_ptr<pfederc::Expr,std::default_delete<pfederc::Expr>>,std::unique_ptr<pfederc::BodyExpr,std::default_delete<pfederc::BodyExpr>>>,std::allocator<std::tuple<std::unique_ptr<pfederc::Expr,std::default_delete<pfederc::Expr>>,std::unique_ptr<pfederc::BodyExpr,std::default_delete<pfederc::BodyExpr>>>>>
                *)&cases,&startifcase);
  }
  elseBody._M_t.super___uniq_ptr_impl<pfederc::BodyExpr,_std::default_delete<pfederc::BodyExpr>_>.
  _M_t.super__Tuple_impl<0UL,_pfederc::BodyExpr_*,_std::default_delete<pfederc::BodyExpr>_>.
  super__Head_base<0UL,_pfederc::BodyExpr_*,_false>._M_head_impl =
       (__uniq_ptr_data<pfederc::BodyExpr,_std::default_delete<pfederc::BodyExpr>,_true,_true>)
       (__uniq_ptr_impl<pfederc::BodyExpr,_std::default_delete<pfederc::BodyExpr>_>)0x0;
  do {
    bVar3 = expect(this_00,TOK_KW_ELSE);
    if (!bVar3) {
LAB_00114f62:
      bVar3 = expect(this_00,TOK_STMT);
      if (!bVar3) {
        local_92 = STX_ERR_EXPECTED_ARR_CLOSING_BRACKET;
        local_6c = (undefined1  [4])0xc;
        std::
        make_unique<pfederc::Error<pfederc::SyntaxErrorCode>,pfederc::Level,pfederc::SyntaxErrorCode,pfederc::Position_const&>
                  ((Level *)&ifcase,(SyntaxErrorCode *)&local_92,(Position *)local_6c);
        generateError((Parser *)&stack0xffffffffffffffc8,
                      (unique_ptr<pfederc::Error<pfederc::SyntaxErrorCode>,_std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>_>
                       *)this_00);
        std::unique_ptr<pfederc::ErrorExpr,_std::default_delete<pfederc::ErrorExpr>_>::~unique_ptr
                  ((unique_ptr<pfederc::ErrorExpr,_std::default_delete<pfederc::ErrorExpr>_> *)
                   &stack0xffffffffffffffc8);
        std::
        unique_ptr<pfederc::Error<pfederc::SyntaxErrorCode>,_std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>_>
        ::~unique_ptr((unique_ptr<pfederc::Error<pfederc::SyntaxErrorCode>,_std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>_>
                       *)&ifcase);
      }
      if (startifcase.
          super__Tuple_impl<0UL,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::BodyExpr,_std::default_delete<pfederc::BodyExpr>_>_>
          .
          super__Tuple_impl<1UL,_std::unique_ptr<pfederc::BodyExpr,_std::default_delete<pfederc::BodyExpr>_>_>
          .
          super__Head_base<1UL,_std::unique_ptr<pfederc::BodyExpr,_std::default_delete<pfederc::BodyExpr>_>,_false>
          ._M_head_impl._M_t.
          super___uniq_ptr_impl<pfederc::BodyExpr,_std::default_delete<pfederc::BodyExpr>_>._M_t.
          super__Tuple_impl<0UL,_pfederc::BodyExpr_*,_std::default_delete<pfederc::BodyExpr>_>.
          super__Head_base<0UL,_pfederc::BodyExpr_*,_false>._M_head_impl !=
          (unique_ptr<pfederc::BodyExpr,_std::default_delete<pfederc::BodyExpr>_>)0x0 &&
          startifcase.
          super__Tuple_impl<0UL,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::BodyExpr,_std::default_delete<pfederc::BodyExpr>_>_>
          .
          super__Head_base<0UL,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_false>
          ._M_head_impl._M_t.
          super___uniq_ptr_impl<pfederc::Expr,_std::default_delete<pfederc::Expr>_>._M_t.
          super__Tuple_impl<0UL,_pfederc::Expr_*,_std::default_delete<pfederc::Expr>_>.
          super__Head_base<0UL,_pfederc::Expr_*,_false>._M_head_impl !=
          (__uniq_ptr_data<pfederc::Expr,_std::default_delete<pfederc::Expr>,_true,_true>)0x0) {
        std::
        make_unique<pfederc::IfExpr,pfederc::Lexer&,pfederc::Position&,std::vector<std::tuple<std::unique_ptr<pfederc::Expr,std::default_delete<pfederc::Expr>>,std::unique_ptr<pfederc::BodyExpr,std::default_delete<pfederc::BodyExpr>>>,std::allocator<std::tuple<std::unique_ptr<pfederc::Expr,std::default_delete<pfederc::Expr>>,std::unique_ptr<pfederc::BodyExpr,std::default_delete<pfederc::BodyExpr>>>>>,std::unique_ptr<pfederc::BodyExpr,std::default_delete<pfederc::BodyExpr>>,bool&>
                  ((Lexer *)&ifcase,(Position *)this_00->lexer,&local_58,
                   (unique_ptr<pfederc::BodyExpr,_std::default_delete<pfederc::BodyExpr>_> *)&cases,
                   (bool *)&elseBody);
        _Var4._M_head_impl = local_90._M_head_impl;
        _Var2 = ifcase.
                super__Tuple_impl<0UL,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::BodyExpr,_std::default_delete<pfederc::BodyExpr>_>_>
                .
                super__Tuple_impl<1UL,_std::unique_ptr<pfederc::BodyExpr,_std::default_delete<pfederc::BodyExpr>_>_>
        ;
        ifcase.
        super__Tuple_impl<0UL,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::BodyExpr,_std::default_delete<pfederc::BodyExpr>_>_>
        .
        super__Tuple_impl<1UL,_std::unique_ptr<pfederc::BodyExpr,_std::default_delete<pfederc::BodyExpr>_>_>
        .
        super__Head_base<1UL,_std::unique_ptr<pfederc::BodyExpr,_std::default_delete<pfederc::BodyExpr>_>,_false>
        ._M_head_impl._M_t.
        super___uniq_ptr_impl<pfederc::BodyExpr,_std::default_delete<pfederc::BodyExpr>_>._M_t.
        super__Tuple_impl<0UL,_pfederc::BodyExpr_*,_std::default_delete<pfederc::BodyExpr>_>.
        super__Head_base<0UL,_pfederc::BodyExpr_*,_false>._M_head_impl =
             (_Head_base<1UL,_std::unique_ptr<pfederc::BodyExpr,_std::default_delete<pfederc::BodyExpr>_>,_false>
              )(unique_ptr<pfederc::BodyExpr,_std::default_delete<pfederc::BodyExpr>_>)0x0;
        (local_90._M_head_impl)->_vptr_Expr =
             (_func_int **)
             _Var2.
             super__Head_base<1UL,_std::unique_ptr<pfederc::BodyExpr,_std::default_delete<pfederc::BodyExpr>_>,_false>
             ._M_head_impl._M_t.
             super___uniq_ptr_impl<pfederc::BodyExpr,_std::default_delete<pfederc::BodyExpr>_>._M_t.
             super__Tuple_impl<0UL,_pfederc::BodyExpr_*,_std::default_delete<pfederc::BodyExpr>_>.
             super__Head_base<0UL,_pfederc::BodyExpr_*,_false>._M_head_impl;
        std::unique_ptr<pfederc::IfExpr,_std::default_delete<pfederc::IfExpr>_>::~unique_ptr
                  ((unique_ptr<pfederc::IfExpr,_std::default_delete<pfederc::IfExpr>_> *)&ifcase);
      }
      else {
        (local_90._M_head_impl)->_vptr_Expr = 0;
        _Var4._M_head_impl = local_90._M_head_impl;
      }
      std::unique_ptr<pfederc::BodyExpr,_std::default_delete<pfederc::BodyExpr>_>::~unique_ptr
                (&elseBody);
      std::
      _Tuple_impl<0UL,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::BodyExpr,_std::default_delete<pfederc::BodyExpr>_>_>
      ::~_Tuple_impl(&startifcase.
                      super__Tuple_impl<0UL,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::BodyExpr,_std::default_delete<pfederc::BodyExpr>_>_>
                    );
      std::
      vector<std::tuple<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::BodyExpr,_std::default_delete<pfederc::BodyExpr>_>_>,_std::allocator<std::tuple<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::BodyExpr,_std::default_delete<pfederc::BodyExpr>_>_>_>_>
      ::~vector(&cases);
      return (__uniq_ptr_data<pfederc::Expr,_std::default_delete<pfederc::Expr>,_true,_true>)
             (tuple<pfederc::Expr_*,_std::default_delete<pfederc::Expr>_>)_Var4._M_head_impl;
    }
    bVar3 = Token::operator==(this_00->lexer->currentToken,TOK_EOL);
    if (bVar3) {
      Lexer::next(this_00->lexer);
      parseFunctionBody((Parser *)&ifcase);
      _Var2 = ifcase.
              super__Tuple_impl<0UL,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::BodyExpr,_std::default_delete<pfederc::BodyExpr>_>_>
              .
              super__Tuple_impl<1UL,_std::unique_ptr<pfederc::BodyExpr,_std::default_delete<pfederc::BodyExpr>_>_>
      ;
      ifcase.
      super__Tuple_impl<0UL,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::BodyExpr,_std::default_delete<pfederc::BodyExpr>_>_>
      .
      super__Tuple_impl<1UL,_std::unique_ptr<pfederc::BodyExpr,_std::default_delete<pfederc::BodyExpr>_>_>
      .
      super__Head_base<1UL,_std::unique_ptr<pfederc::BodyExpr,_std::default_delete<pfederc::BodyExpr>_>,_false>
      ._M_head_impl._M_t.
      super___uniq_ptr_impl<pfederc::BodyExpr,_std::default_delete<pfederc::BodyExpr>_>._M_t.
      super__Tuple_impl<0UL,_pfederc::BodyExpr_*,_std::default_delete<pfederc::BodyExpr>_>.
      super__Head_base<0UL,_pfederc::BodyExpr_*,_false>._M_head_impl =
           (_Head_base<1UL,_std::unique_ptr<pfederc::BodyExpr,_std::default_delete<pfederc::BodyExpr>_>,_false>
            )(unique_ptr<pfederc::BodyExpr,_std::default_delete<pfederc::BodyExpr>_>)0x0;
      std::__uniq_ptr_impl<pfederc::BodyExpr,_std::default_delete<pfederc::BodyExpr>_>::reset
                ((__uniq_ptr_impl<pfederc::BodyExpr,_std::default_delete<pfederc::BodyExpr>_> *)
                 &elseBody,
                 (pointer)_Var2.
                          super__Head_base<1UL,_std::unique_ptr<pfederc::BodyExpr,_std::default_delete<pfederc::BodyExpr>_>,_false>
                          ._M_head_impl._M_t.
                          super___uniq_ptr_impl<pfederc::BodyExpr,_std::default_delete<pfederc::BodyExpr>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_pfederc::BodyExpr_*,_std::default_delete<pfederc::BodyExpr>_>
                          .super__Head_base<0UL,_pfederc::BodyExpr_*,_false>._M_head_impl);
      std::unique_ptr<pfederc::BodyExpr,_std::default_delete<pfederc::BodyExpr>_>::~unique_ptr
                ((unique_ptr<pfederc::BodyExpr,_std::default_delete<pfederc::BodyExpr>_> *)&ifcase);
      goto LAB_00114f62;
    }
    parseIfStart((Parser *)&ifcase,isensure);
    if ((ifcase.
         super__Tuple_impl<0UL,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::BodyExpr,_std::default_delete<pfederc::BodyExpr>_>_>
         .
         super__Head_base<0UL,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_false>
         ._M_head_impl._M_t.
         super___uniq_ptr_impl<pfederc::Expr,_std::default_delete<pfederc::Expr>_>._M_t.
         super__Tuple_impl<0UL,_pfederc::Expr_*,_std::default_delete<pfederc::Expr>_>.
         super__Head_base<0UL,_pfederc::Expr_*,_false>._M_head_impl !=
         (__uniq_ptr_data<pfederc::Expr,_std::default_delete<pfederc::Expr>,_true,_true>)0x0) &&
       (ifcase.
        super__Tuple_impl<0UL,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::BodyExpr,_std::default_delete<pfederc::BodyExpr>_>_>
        .
        super__Tuple_impl<1UL,_std::unique_ptr<pfederc::BodyExpr,_std::default_delete<pfederc::BodyExpr>_>_>
        .
        super__Head_base<1UL,_std::unique_ptr<pfederc::BodyExpr,_std::default_delete<pfederc::BodyExpr>_>,_false>
        ._M_head_impl._M_t.
        super___uniq_ptr_impl<pfederc::BodyExpr,_std::default_delete<pfederc::BodyExpr>_>._M_t.
        super__Tuple_impl<0UL,_pfederc::BodyExpr_*,_std::default_delete<pfederc::BodyExpr>_>.
        super__Head_base<0UL,_pfederc::BodyExpr_*,_false>._M_head_impl !=
        (unique_ptr<pfederc::BodyExpr,_std::default_delete<pfederc::BodyExpr>_>)0x0)) {
      std::
      vector<std::tuple<std::unique_ptr<pfederc::Expr,std::default_delete<pfederc::Expr>>,std::unique_ptr<pfederc::BodyExpr,std::default_delete<pfederc::BodyExpr>>>,std::allocator<std::tuple<std::unique_ptr<pfederc::Expr,std::default_delete<pfederc::Expr>>,std::unique_ptr<pfederc::BodyExpr,std::default_delete<pfederc::BodyExpr>>>>>
      ::
      emplace_back<std::tuple<std::unique_ptr<pfederc::Expr,std::default_delete<pfederc::Expr>>,std::unique_ptr<pfederc::BodyExpr,std::default_delete<pfederc::BodyExpr>>>>
                ((vector<std::tuple<std::unique_ptr<pfederc::Expr,std::default_delete<pfederc::Expr>>,std::unique_ptr<pfederc::BodyExpr,std::default_delete<pfederc::BodyExpr>>>,std::allocator<std::tuple<std::unique_ptr<pfederc::Expr,std::default_delete<pfederc::Expr>>,std::unique_ptr<pfederc::BodyExpr,std::default_delete<pfederc::BodyExpr>>>>>
                  *)&cases,
                 (tuple<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::BodyExpr,_std::default_delete<pfederc::BodyExpr>_>_>
                  *)&ifcase);
    }
    std::
    _Tuple_impl<0UL,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::BodyExpr,_std::default_delete<pfederc::BodyExpr>_>_>
    ::~_Tuple_impl((_Tuple_impl<0UL,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::BodyExpr,_std::default_delete<pfederc::BodyExpr>_>_>
                    *)&ifcase);
  } while( true );
}

Assistant:

std::unique_ptr<Expr> Parser::parseIf(bool isensure) noexcept {
  Position pos(lexer.getCurrentToken()->getPosition());
  bool err = false;

  std::vector<IfCase> cases;
  IfCase startifcase = parseIfStart(isensure);
  if (std::get<0>(startifcase) && std::get<1>(startifcase))
    cases.push_back(std::move(startifcase));
  else
    err = true;

  std::unique_ptr<BodyExpr> elseBody;
  while (expect(TokenType::TOK_KW_ELSE)) {
    if (*lexer.getCurrentToken() == TokenType::TOK_EOL) {
      lexer.next(); // eat eol
      elseBody = parseFunctionBody();
      break;
    }

    IfCase ifcase = parseIfStart(isensure);
    if (std::get<0>(ifcase) && std::get<1>(ifcase))
      cases.push_back(std::move(ifcase));
  }

  if (!expect(TokenType::TOK_STMT)) {
    generateError(std::make_unique<SyntaxError>(LVL_ERROR,
      SyntaxErrorCode::STX_ERR_EXPECTED_STMT, lexer.getCurrentToken()->getPosition()));
  }

  if (err)
    return nullptr;

  return std::make_unique<IfExpr>(lexer, pos,
    std::move(cases), std::move(elseBody), isensure);
}